

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmStop<(moira::Instr)118,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ims<2> local_34;
  int local_30;
  u32 local_28;
  u16 local_22;
  u32 src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22 = op;
  _src = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_28 = dasmIncRead<2>(this,addr);
  pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
  local_30 = addr_local[0xe];
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_30);
  Ims<2>::Ims(&local_34,local_28);
  StrWriter::operator<<(pSVar1,local_34);
  return;
}

Assistant:

void
Moira::dasmStop(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);

    str << Ins<I>{} << str.tab << Ims<S>(src);
}